

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

Statement * __thiscall
rsg::anon_unknown_0::create<rsg::ConditionalStatement>(anon_unknown_0 *this,GeneratorState *state)

{
  ConditionalStatement *this_00;
  
  this_00 = (ConditionalStatement *)operator_new(0x38);
  ConditionalStatement::ConditionalStatement(this_00,state);
  return &this_00->super_Statement;
}

Assistant:

Statement*	create		(GeneratorState& state)			{ return new T(state);			}